

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monk.cpp
# Opt level: O2

void __thiscall Monk::Monk(Monk *this)

{
  shared_ptr<Position> *__args_2;
  undefined1 local_2c [20];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Hero::Hero(&this->super_Hero,0x14,0,-0x14,0,0x28,300);
  (this->super_Hero)._vptr_Hero = (_func_int **)&PTR__Hero_00116cf8;
  local_2c._0_4_ = Hero::getDamage(&this->super_Hero);
  __args_2 = Hero::getPosition(&this->super_Hero);
  local_2c._8_4_ = 0;
  local_2c._4_4_ = 1;
  std::make_shared<HealStrike,int,std::shared_ptr<Position>const&,Strike::StrikeType,int>
            ((int *)(local_2c + 0xc),(shared_ptr<Position> *)local_2c,(StrikeType *)__args_2,
             (int *)(local_2c + 8));
  std::__shared_ptr<Strike,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Strike,(__gnu_cxx::_Lock_policy)2> *)&(this->super_Hero).m_Strike,
             (__shared_ptr<HealStrike,_(__gnu_cxx::_Lock_policy)2> *)(local_2c + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  (this->super_Hero).m_Class = MONK;
  return;
}

Assistant:

Monk::Monk() : Hero(20, 0, -20, 0, 40, 300)
{
    m_Strike = std::make_shared<HealStrike>(
            getDamage(), getPosition(), Strike::StrikeType::ALIAS, 1);
    m_Class = Hero::Class::MONK;
}